

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_things.cpp
# Opt level: O2

void swrenderer::R_DrawParticle_C(vissprite_t *vis)

{
  byte bVar1;
  short sVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  DWORD DVar6;
  int iVar7;
  bool bVar8;
  byte *pbVar9;
  int y;
  uint uVar10;
  int iVar11;
  uint uVar12;
  DrawerCommandQueue *this;
  short sVar13;
  short sVar14;
  int x1;
  int iVar15;
  
  bVar1 = (vis->Style).colormap[(vis->field_14).field_0.startfrac];
  iVar4 = (vis->field_3).field_1.y1;
  iVar5 = (vis->field_3).field_1.y2;
  sVar2 = vis->x1;
  iVar15 = (int)sVar2;
  sVar3 = vis->x2;
  this = (DrawerCommandQueue *)vis;
  uVar10 = _DAT_00726b44;
  while (uVar12 = uVar10, FirstInterestingDrawseg < uVar12) {
    uVar10 = uVar12 - 1;
    this = (DrawerCommandQueue *)(*(long *)(InterestingDrawsegs + (ulong)uVar10 * 8) * 0x98);
    if (*(int *)(this->memorypool + drawsegs + 0x70) == 0) {
      this = (DrawerCommandQueue *)(this->memorypool + drawsegs);
      sVar13 = *(short *)(this->memorypool + 0x18);
      if ((((sVar13 < sVar3) && (sVar14 = *(short *)(this->memorypool + 0x1a), sVar2 < sVar14)) &&
          (((float)((sVar3 + iVar15) / 2 - (int)*(short *)(this->memorypool + 0x1c)) *
           (*(float *)(this->memorypool + 0x2c) - *(float *)(this->memorypool + 0x28))) /
           (float)((int)*(short *)(this->memorypool + 0x1e) -
                  (int)*(short *)(this->memorypool + 0x1c)) + *(float *)(this->memorypool + 0x28) <
           vis->idepth)) && (*(int *)(this->memorypool + 0x90) == vis->CurrentPortalUniq)) {
        if (sVar13 <= sVar2) {
          sVar13 = sVar2;
        }
        if (sVar3 <= sVar14) {
          sVar14 = sVar3;
        }
        R_RenderMaskedSegRange((drawseg_t *)this,(int)sVar13,(int)sVar14);
        uVar10 = uVar12 - 1;
      }
    }
  }
  DrawerCommandQueue::WaitForWorkers(this);
  uVar10 = vis->renderflags * 0x100 + 0x100;
  DVar6 = Col2RGB8[(int)uVar10 >> 10][bVar1];
  iVar7 = RenderTarget->Pitch;
  for (; iVar15 < sVar3; iVar15 = iVar15 + 1) {
    drawerargs::dc_x = iVar15;
    bVar8 = R_ClipSpriteColumnWithPortals(vis);
    if (!bVar8) {
      pbVar9 = (byte *)((long)iVar15 + (long)(int)(&ylookup)[iVar4] + drawerargs::dc_destorg);
      for (iVar11 = 0; iVar11 <= iVar5 - iVar4; iVar11 = iVar11 + 1) {
        uVar12 = Col2RGB8[(int)(0x10000 - (uVar10 & 0xfffffc00)) >> 10][*pbVar9] + DVar6 | 0x1f07c1f
        ;
        *pbVar9 = RGB32k.All[uVar12 >> 0xf & uVar12];
        pbVar9 = pbVar9 + iVar7;
      }
    }
  }
  return;
}

Assistant:

void R_DrawParticle_C (vissprite_t *vis)
{
	DWORD *bg2rgb;
	int spacing;
	BYTE *dest;
	DWORD fg;
	BYTE color = vis->Style.colormap[vis->startfrac];
	int yl = vis->y1;
	int ycount = vis->y2 - yl + 1;
	int x1 = vis->x1;
	int countbase = vis->x2 - x1;

	R_DrawMaskedSegsBehindParticle (vis);

	DrawerCommandQueue::WaitForWorkers();

	// vis->renderflags holds translucency level (0-255)
	{
		fixed_t fglevel, bglevel;
		DWORD *fg2rgb;

		fglevel = ((vis->renderflags + 1) << 8) & ~0x3ff;
		bglevel = FRACUNIT-fglevel;
		fg2rgb = Col2RGB8[fglevel>>10];
		bg2rgb = Col2RGB8[bglevel>>10];
		fg = fg2rgb[color];
	}

	/*

	spacing = RenderTarget->GetPitch() - countbase;
	dest = ylookup[yl] + x1 + dc_destorg;

	do
	{
		int count = countbase;
		do
		{
			DWORD bg = bg2rgb[*dest];
			bg = (fg+bg) | 0x1f07c1f;
			*dest++ = RGB32k.All[bg & (bg>>15)];
		} while (--count);
		dest += spacing;
	} while (--ycount);*/

	// original was row-wise
	// width = countbase
	// height = ycount

	spacing = RenderTarget->GetPitch();

	for (int x = x1; x < (x1+countbase); x++)
	{
		dc_x = x;
		if (R_ClipSpriteColumnWithPortals(vis))
			continue;
		dest = ylookup[yl] + x + dc_destorg;
		for (int y = 0; y < ycount; y++)
		{
			DWORD bg = bg2rgb[*dest];
			bg = (fg+bg) | 0x1f07c1f;
			*dest = RGB32k.All[bg & (bg>>15)];
			dest += spacing;
		}
	}
}